

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O0

IterateResult __thiscall glcts::BlendEquationSeparateCase::ModeCase::iterate(ModeCase *this)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  char *local_58;
  bool local_42;
  bool local_41;
  int local_30;
  bool pass;
  GLint alphaEq;
  bool alphaOk;
  GLint rgbEq;
  bool rgbOk;
  Functions *gl;
  ModeCase *this_local;
  
  gl = (Functions *)this;
  bVar1 = IsExtensionSupported((this->super_TestCase).m_context,"GL_KHR_blend_equation_advanced");
  if (bVar1) {
    pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    _rgbEq = CONCAT44(extraout_var,iVar2);
    (**(code **)(_rgbEq + 0x108))(this->m_mode,0x8006);
    iVar2 = (**(code **)(_rgbEq + 0x800))();
    alphaOk = iVar2 == 0x500;
    alphaEq = 0;
    (**(code **)(_rgbEq + 0x868))(0x8009,&alphaEq);
    local_41 = (alphaOk & 1U) != 0 && alphaEq == 0x8006;
    alphaOk = local_41;
    (**(code **)(_rgbEq + 0x108))(0x8006,this->m_mode);
    iVar2 = (**(code **)(_rgbEq + 0x800))();
    pass = iVar2 == 0x500;
    local_30 = 0;
    (**(code **)(_rgbEq + 0x868))(0x883d,&local_30);
    local_42 = (pass & 1U) != 0 && local_30 == 0x8006;
    pass = local_42;
    bVar1 = false;
    if ((alphaOk & 1U) != 0) {
      bVar1 = local_42;
    }
    if (bVar1) {
      local_58 = "Pass";
    }
    else {
      local_58 = "Fail";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar1,local_58)
    ;
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"GL_KHR_blend_equation_advanced");
  }
  return STOP;
}

Assistant:

IterateResult iterate(void)
		{
			// Check that extension is supported.
			if (!IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced"))
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_KHR_blend_equation_advanced");
				return STOP;
			}

			const glw::Functions& gl = m_context.getRenderContext().getFunctions();

			// Set separate blend equations.
			// Expect error and that default value (FUNC_ADD) is not changed.

			// RGB.
			gl.blendEquationSeparate(m_mode, GL_FUNC_ADD);
			bool	   rgbOk = gl.getError() == GL_INVALID_ENUM;
			glw::GLint rgbEq = GL_NONE;
			gl.getIntegerv(GL_BLEND_EQUATION_RGB, &rgbEq);
			rgbOk = rgbOk && (rgbEq == GL_FUNC_ADD);

			// Alpha.
			gl.blendEquationSeparate(GL_FUNC_ADD, m_mode);
			bool	   alphaOk = gl.getError() == GL_INVALID_ENUM;
			glw::GLint alphaEq = GL_NONE;
			gl.getIntegerv(GL_BLEND_EQUATION_ALPHA, &alphaEq);
			alphaOk = alphaOk && (alphaEq == GL_FUNC_ADD);

			bool pass = rgbOk && alphaOk;
			m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, pass ? "Pass" : "Fail");
			return STOP;
		}